

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::setupRender
          (BBoxRenderCase *this,IterationConfig *config)

{
  code *pcVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  deBool dVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  ShaderProgram *pSVar13;
  TestError *pTVar14;
  TestLog *pTVar15;
  MessageBuilder *pMVar16;
  ObjectWrapper *pOVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  GLint bboxMaxPos;
  GLint bboxMinPos;
  float local_1e0;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  MessageBuilder local_1c0;
  int local_2c;
  int local_28;
  GLint posScaleLocation;
  GLint colLocation;
  GLint posLocation;
  Functions *gl;
  IterationConfig *config_local;
  BBoxRenderCase *this_local;
  
  gl = (Functions *)config;
  config_local = (IterationConfig *)this;
  pRVar12 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar12->_vptr_RenderContext[3])();
  _colLocation = CONCAT44(extraout_var,iVar4);
  pcVar1 = *(code **)(_colLocation + 0x780);
  pSVar13 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator->(&(this->m_program).
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
  dVar5 = glu::ShaderProgram::getProgram(pSVar13);
  posScaleLocation = (*pcVar1)(dVar5,"a_position");
  pcVar1 = *(code **)(_colLocation + 0x780);
  pSVar13 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator->(&(this->m_program).
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
  dVar5 = glu::ShaderProgram::getProgram(pSVar13);
  local_28 = (*pcVar1)(dVar5,"a_color");
  pcVar1 = *(code **)(_colLocation + 0xb48);
  pSVar13 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
            operator->(&(this->m_program).
                        super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                      );
  dVar5 = glu::ShaderProgram::getProgram(pSVar13);
  local_2c = (*pcVar1)(dVar5,"u_posScale");
  while ((dVar6 = ::deGetFalse(), dVar6 == 0 && (posScaleLocation != -1))) {
    dVar6 = ::deGetFalse();
    if (dVar6 == 0) {
      while ((dVar6 = ::deGetFalse(), dVar6 == 0 && (local_28 != -1))) {
        dVar6 = ::deGetFalse();
        if (dVar6 == 0) {
          while ((dVar6 = ::deGetFalse(), dVar6 == 0 && (local_2c != -1))) {
            dVar6 = ::deGetFalse();
            if (dVar6 == 0) {
              pTVar15 = tcu::TestContext::getLog
                                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_1c0,pTVar15,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar16 = tcu::MessageBuilder::operator<<
                                  (&local_1c0,(char (*) [22])"Setting viewport to (");
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [4])0xfb1fba);
              local_1c4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)gl);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,&local_1c4);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [3])0xf95514);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [4])0xfa4e03);
              local_1c8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)gl);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,&local_1c8);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [3])0xf95514);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [4])0xf048c0);
              local_1cc = tcu::Vector<int,_2>::x((Vector<int,_2> *)&gl->activeTexture);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,&local_1cc);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [3])0xf95514);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [4])0xf50fa5);
              local_1d0 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&gl->activeTexture);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,&local_1d0);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [3])0xf53dcb);
              pMVar16 = tcu::MessageBuilder::operator<<
                                  (pMVar16,(char (*) [34])"Vertex coordinates are in range:\n");
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [6])"\tx: [");
              local_1d4 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&gl->attachShader);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,&local_1d4);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [3])0xf95514);
              fVar18 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&gl->attachShader);
              local_1d8 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&gl->beginConditionalRender);
              local_1d8 = fVar18 + local_1d8;
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,&local_1d8);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [3])0xfa5e60);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [6])"\ty: [");
              local_1dc = tcu::Vector<float,_2>::y((Vector<float,_2> *)&gl->attachShader);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,&local_1dc);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [3])0xf95514);
              fVar18 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&gl->attachShader);
              local_1e0 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&gl->beginConditionalRender);
              local_1e0 = fVar18 + local_1e0;
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,&local_1e0);
              pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [3])0xfa5e60);
              tcu::MessageBuilder::operator<<(pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_1c0);
              if ((this->m_calcPerPrimitiveBBox & 1U) == 0) {
                pTVar15 = tcu::TestContext::getLog
                                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
                ;
                tcu::TestLog::operator<<
                          ((MessageBuilder *)&bboxMaxPos,pTVar15,
                           (BeginMessageToken *)&tcu::TestLog::Message);
                pMVar16 = tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)&bboxMaxPos,
                                     (char (*) [36])"Setting primitive bounding box to:\n");
                pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [2])0xf2b66e);
                pMVar16 = tcu::MessageBuilder::operator<<
                                    (pMVar16,(Vector<float,_4> *)&gl->beginQuery);
                pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [2])0xf12600);
                pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [2])0xf2b66e);
                pMVar16 = tcu::MessageBuilder::operator<<
                                    (pMVar16,(Vector<float,_4> *)&gl->beginTransformFeedback);
                pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,(char (*) [2])0xf12600);
                tcu::MessageBuilder::operator<<
                          (pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
                tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&bboxMaxPos);
              }
              if ((this->m_useGlobalState & 1U) == 0) {
                (**(code **)(_colLocation + 0x1040))(0xc0000000,0xc0000000,0,0x3f800000,0xbfd9999a);
              }
              else {
                pcVar1 = *(code **)(_colLocation + 0x1040);
                fVar18 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&gl->beginQuery);
                fVar19 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&gl->beginQuery);
                fVar20 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&gl->beginQuery);
                fVar21 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&gl->beginQuery);
                fVar22 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&gl->beginTransformFeedback);
                fVar23 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&gl->beginTransformFeedback);
                fVar24 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&gl->beginTransformFeedback);
                fVar25 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&gl->beginTransformFeedback);
                (*pcVar1)(fVar18,fVar19,fVar20,fVar21,fVar22,fVar23,fVar24,fVar25);
              }
              bVar3 = de::details::UniqueBase::operator_cast_to_bool((UniqueBase *)&this->m_fbo);
              if (bVar3) {
                pcVar1 = *(code **)(_colLocation + 0x78);
                pOVar17 = &de::details::
                           UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                           ::operator*(&(this->m_fbo).
                                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
                                      )->super_ObjectWrapper;
                dVar5 = glu::ObjectWrapper::operator*(pOVar17);
                (*pcVar1)(0x8ca9,dVar5);
              }
              pcVar1 = *(code **)(_colLocation + 0x1a00);
              iVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)gl);
              iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)gl);
              iVar8 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&gl->activeTexture);
              iVar9 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&gl->activeTexture);
              (*pcVar1)(iVar4,iVar7,iVar8,iVar9);
              (**(code **)(_colLocation + 0x1c0))(0,0,0,0x3f800000);
              (**(code **)(_colLocation + 0x188))(0x4000);
              pcVar1 = *(code **)(_colLocation + 0x40);
              pOVar17 = &de::details::
                         UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                         ::operator*(&(this->m_vbo).
                                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                                    )->super_ObjectWrapper;
              dVar5 = glu::ObjectWrapper::operator*(pOVar17);
              (*pcVar1)(0x8892,dVar5);
              (**(code **)(_colLocation + 0x19f0))(posScaleLocation,4,0x1406,0,0x20,0);
              (**(code **)(_colLocation + 0x19f0))(local_28,4,0x1406,0,0x20,0x10);
              (**(code **)(_colLocation + 0x610))(posScaleLocation);
              (**(code **)(_colLocation + 0x610))(local_28);
              pcVar1 = *(code **)(_colLocation + 0x1680);
              pSVar13 = de::details::
                        UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
                        operator->(&(this->m_program).
                                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                  );
              dVar5 = glu::ShaderProgram::getProgram(pSVar13);
              (*pcVar1)(dVar5);
              iVar4 = local_2c;
              pcVar1 = *(code **)(_colLocation + 0x15a0);
              fVar18 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&gl->attachShader);
              fVar19 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&gl->attachShader);
              fVar20 = tcu::Vector<float,_2>::x((Vector<float,_2> *)&gl->beginConditionalRender);
              fVar21 = tcu::Vector<float,_2>::y((Vector<float,_2> *)&gl->beginConditionalRender);
              (*pcVar1)(fVar18,fVar19,fVar20,fVar21,iVar4);
              pcVar1 = *(code **)(_colLocation + 0xb48);
              pSVar13 = de::details::
                        UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
                        operator->(&(this->m_program).
                                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                  );
              dVar5 = glu::ShaderProgram::getProgram(pSVar13);
              uVar10 = (*pcVar1)(dVar5,"u_primitiveBBoxMin");
              pcVar1 = *(code **)(_colLocation + 0xb48);
              pSVar13 = de::details::
                        UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
                        operator->(&(this->m_program).
                                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                  );
              dVar5 = glu::ShaderProgram::getProgram(pSVar13);
              uVar11 = (*pcVar1)(dVar5,"u_primitiveBBoxMax");
              pcVar1 = *(code **)(_colLocation + 0x15a0);
              fVar18 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&gl->beginQuery);
              fVar19 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&gl->beginQuery);
              fVar20 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&gl->beginQuery);
              fVar21 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&gl->beginQuery);
              (*pcVar1)(fVar18,fVar19,fVar20,fVar21,uVar10);
              pcVar1 = *(code **)(_colLocation + 0x15a0);
              fVar18 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&gl->beginTransformFeedback);
              fVar19 = tcu::Vector<float,_4>::y((Vector<float,_4> *)&gl->beginTransformFeedback);
              fVar20 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&gl->beginTransformFeedback);
              fVar21 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&gl->beginTransformFeedback);
              (*pcVar1)(fVar18,fVar19,fVar20,fVar21,uVar11);
              pcVar1 = *(code **)(_colLocation + 0x1530);
              pcVar2 = *(code **)(_colLocation + 0xb48);
              pSVar13 = de::details::
                        UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
                        operator->(&(this->m_program).
                                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                  );
              dVar5 = glu::ShaderProgram::getProgram(pSVar13);
              uVar10 = (*pcVar2)(dVar5,"u_viewportPos");
              iVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)gl);
              iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)gl);
              (*pcVar1)(uVar10,iVar4,iVar7);
              pcVar1 = *(code **)(_colLocation + 0x1530);
              pcVar2 = *(code **)(_colLocation + 0xb48);
              pSVar13 = de::details::
                        UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::
                        operator->(&(this->m_program).
                                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                  );
              dVar5 = glu::ShaderProgram::getProgram(pSVar13);
              uVar10 = (*pcVar2)(dVar5,"u_viewportSize");
              iVar4 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&gl->activeTexture);
              iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&gl->activeTexture);
              (*pcVar1)(uVar10,iVar4,iVar7);
              dVar5 = (**(code **)(_colLocation + 0x800))();
              glu::checkError(dVar5,"setup",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                              ,0x386);
              return;
            }
          }
          pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar14,(char *)0x0,"posScaleLocation != -1",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                     ,0x34e);
          __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar14,(char *)0x0,"colLocation != -1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                 ,0x34d);
      __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar14,(char *)0x0,"posLocation != -1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
             ,0x34c);
  __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void BBoxRenderCase::setupRender (const IterationConfig& config)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glw::GLint		posLocation			= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const glw::GLint		colLocation			= gl.getAttribLocation(m_program->getProgram(), "a_color");
	const glw::GLint		posScaleLocation	= gl.getUniformLocation(m_program->getProgram(), "u_posScale");

	TCU_CHECK(posLocation != -1);
	TCU_CHECK(colLocation != -1);
	TCU_CHECK(posScaleLocation != -1);

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Setting viewport to ("
			<< "x: " << config.viewportPos.x() << ", "
			<< "y: " << config.viewportPos.y() << ", "
			<< "w: " << config.viewportSize.x() << ", "
			<< "h: " << config.viewportSize.y() << ")\n"
		<< "Vertex coordinates are in range:\n"
			<< "\tx: [" << config.patternPos.x() << ", " << (config.patternPos.x() + config.patternSize.x()) << "]\n"
			<< "\ty: [" << config.patternPos.y() << ", " << (config.patternPos.y() + config.patternSize.y()) << "]\n"
		<< tcu::TestLog::EndMessage;

	if (!m_calcPerPrimitiveBBox)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Setting primitive bounding box to:\n"
				<< "\t" << config.bbox.min << "\n"
				<< "\t" << config.bbox.max << "\n"
			<< tcu::TestLog::EndMessage;

	if (m_useGlobalState)
		gl.primitiveBoundingBox(config.bbox.min.x(), config.bbox.min.y(), config.bbox.min.z(), config.bbox.min.w(),
								config.bbox.max.x(), config.bbox.max.y(), config.bbox.max.z(), config.bbox.max.w());
	else
		// state is overriden by the tessellation output, set bbox to invisible area to imitiate dirty state left by application
		gl.primitiveBoundingBox(-2.0f, -2.0f, 0.0f, 1.0f,
								-1.7f, -1.7f, 0.0f, 1.0f);

	if (m_fbo)
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, **m_fbo);

	gl.viewport(config.viewportPos.x(), config.viewportPos.y(), config.viewportSize.x(), config.viewportSize.y());
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, (int)(VA_NUM_ATTRIB_VECS * sizeof(float[4])), (const float*)DE_NULL + 4 * VA_POS_VEC_NDX);
	gl.vertexAttribPointer(colLocation, 4, GL_FLOAT, GL_FALSE, (int)(VA_NUM_ATTRIB_VECS * sizeof(float[4])), (const float*)DE_NULL + 4 * VA_COL_VEC_NDX);
	gl.enableVertexAttribArray(posLocation);
	gl.enableVertexAttribArray(colLocation);
	gl.useProgram(m_program->getProgram());
	gl.uniform4f(posScaleLocation, config.patternPos.x(), config.patternPos.y(), config.patternSize.x(), config.patternSize.y());

	{
		const glw::GLint bboxMinPos = gl.getUniformLocation(m_program->getProgram(), "u_primitiveBBoxMin");
		const glw::GLint bboxMaxPos = gl.getUniformLocation(m_program->getProgram(), "u_primitiveBBoxMax");

		gl.uniform4f(bboxMinPos, config.bbox.min.x(), config.bbox.min.y(), config.bbox.min.z(), config.bbox.min.w());
		gl.uniform4f(bboxMaxPos, config.bbox.max.x(), config.bbox.max.y(), config.bbox.max.z(), config.bbox.max.w());
	}

	gl.uniform2i(gl.getUniformLocation(m_program->getProgram(), "u_viewportPos"), config.viewportPos.x(), config.viewportPos.y());
	gl.uniform2i(gl.getUniformLocation(m_program->getProgram(), "u_viewportSize"), config.viewportSize.x(), config.viewportSize.y());

	GLU_EXPECT_NO_ERROR(gl.getError(), "setup");
}